

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

void __thiscall
cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::add_tag
          (rules_holder<cppcms::xss::icompare_c_string,_false> *this,string *name,tag_type type)

{
  mapped_type *pmVar1;
  undefined1 auStack_48 [48];
  
  details::c_string::c_string((c_string *)auStack_48,name);
  pmVar1 = std::
           map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
           ::operator[](&this->tags,(key_type *)auStack_48);
  pmVar1->type = type;
  std::__cxx11::string::~string((string *)(auStack_48 + 0x10));
  return;
}

Assistant:

void add_tag(std::string const &name,rules::tag_type type)
		{
			tags[c_string(name)].type=type;
		}